

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

void __thiscall MTRand::seed(MTRand *this)

{
  FILE *__stream;
  size_t sVar1;
  time_t t;
  clock_t c;
  uint32 oneSeed;
  long lVar2;
  bool bVar3;
  uint32 bigSeed [624];
  
  __stream = fopen("/dev/urandom","rb");
  if (__stream != (FILE *)0x0) {
    bVar3 = true;
    for (lVar2 = 0; (bVar3 && ((int)lVar2 != 0x1380)); lVar2 = lVar2 + 8) {
      sVar1 = fread((void *)((long)bigSeed + lVar2),8,1,__stream);
      bVar3 = sVar1 != 0;
    }
    fclose(__stream);
    if (bVar3) {
      seed(this,bigSeed,0x270);
      return;
    }
  }
  t = time((time_t *)0x0);
  c = clock();
  oneSeed = hash(t,c);
  seed(this,oneSeed);
  return;
}

Assistant:

void MTRand::seed() {
  // Seed the generator with an array from /dev/urandom if available
  // Otherwise use a hash of time() and clock() values

  // First try getting an array from /dev/urandom
  FILE *urandom = fopen("/dev/urandom", "rb");
  if (urandom) {
    uint32 bigSeed[N];
    uint32 *s = bigSeed;
    int i = N;
    bool success = true;
    while (success && i--)
      success = fread(s++, sizeof(uint32), 1, urandom);
    fclose(urandom);
    if (success) {
      seed(bigSeed, N);
      return;
    }
  }

  // Was not successful, so use time() and clock() instead
  seed(hash(time(NULL), clock()));
}